

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

void EndDrawing(void)

{
  AutomationEvent *pAVar1;
  Vector2 VVar2;
  double dVar3;
  uint uVar4;
  uchar *pixelData;
  char *pcVar5;
  int button_1;
  long lVar6;
  int gamepad;
  int gamepad_00;
  ulong uVar7;
  uint uVar8;
  int key;
  long lVar9;
  AutomationEventList *pAVar10;
  float fVar11;
  float fVar12;
  long local_70;
  MsfGifResult result;
  
  rlDrawRenderBatchActive();
  if (gifRecording == '\x01') {
    gifFrameCounter = (int)(long)((float)CORE.Time.frame * 1000.0) + gifFrameCounter;
    if (100 < gifFrameCounter) {
      VVar2 = GetWindowScaleDPI();
      pixelData = rlReadScreenPixels((int)((float)CORE.Window.render.width * VVar2.x),
                                     (int)(VVar2.y * (float)CORE.Window.render.height));
      msf_gif_frame(&gifState,pixelData,gifFrameCounter / 10,0x10,
                    (int)((float)CORE.Window.render.width * VVar2.x) << 2);
      gifFrameCounter = gifFrameCounter - 100;
      free(pixelData);
    }
    dVar3 = glfwGetTime();
    if (((int)(dVar3 + dVar3) & 0x80000001U) == 1) {
      DrawCircle(0x1e,CORE.Window.screen.height - 0x14,10.0,(Color)0xff3721be);
      DrawText("GIF RECORDING",0x32,CORE.Window.screen.height - 0x19,10,(Color)0xff3729e6);
    }
    rlDrawRenderBatchActive();
  }
  if (automationEventRecording == '\x01') {
    uVar8 = currentEventList->capacity;
    uVar7 = (ulong)currentEventList->count;
    if (currentEventList->count != uVar8) {
      lVar9 = 0;
      pAVar10 = currentEventList;
      do {
        if (lVar9 == 0x200) {
          lVar9 = 0;
          goto LAB_0011fd97;
        }
        if ((CORE.Input.Keyboard.previousKeyState[lVar9] != '\0') &&
           (CORE.Input.Keyboard.currentKeyState[lVar9] == '\0')) {
          pAVar10->events[uVar7].frame = CORE.Time.frameCounter;
          pAVar10->events[pAVar10->count].type = 1;
          pAVar10->events[pAVar10->count].params[0] = (int)lVar9;
          pAVar10->events[pAVar10->count].params[1] = 0;
          pAVar10->events[pAVar10->count].params[2] = 0;
          pAVar1 = pAVar10->events;
          uVar8 = pAVar10->count;
          TraceLog(3,
                   "AUTOMATION: Frame: %i | Event type: INPUT_KEY_UP | Event parameters: %i, %i, %i"
                   ,(ulong)pAVar1[uVar8].frame,(ulong)(uint)pAVar1[uVar8].params[0],
                   (ulong)(uint)pAVar1[uVar8].params[1],(ulong)(uint)pAVar1[uVar8].params[2]);
          pAVar10 = currentEventList;
          currentEventList->count = currentEventList->count + 1;
          uVar8 = pAVar10->capacity;
        }
        uVar7 = (ulong)pAVar10->count;
        if (pAVar10->count == uVar8) break;
        if (CORE.Input.Keyboard.currentKeyState[lVar9] != '\0') {
          pAVar10->events[uVar7].frame = CORE.Time.frameCounter;
          pAVar10->events[pAVar10->count].type = 2;
          pAVar10->events[pAVar10->count].params[0] = (int)lVar9;
          pAVar10->events[pAVar10->count].params[1] = 0;
          pAVar10->events[pAVar10->count].params[2] = 0;
          pAVar1 = pAVar10->events;
          uVar8 = pAVar10->count;
          TraceLog(3,
                   "AUTOMATION: Frame: %i | Event type: INPUT_KEY_DOWN | Event parameters: %i, %i, %i"
                   ,(ulong)pAVar1[uVar8].frame,(ulong)(uint)pAVar1[uVar8].params[0],
                   (ulong)(uint)pAVar1[uVar8].params[1],(ulong)(uint)pAVar1[uVar8].params[2]);
          pAVar10 = currentEventList;
          uVar8 = currentEventList->capacity;
          uVar4 = currentEventList->count + 1;
          uVar7 = (ulong)uVar4;
          currentEventList->count = uVar4;
        }
        lVar9 = lVar9 + 1;
      } while ((uint)uVar7 != uVar8);
    }
  }
  goto LAB_001205d0;
  while( true ) {
    if ((CORE.Input.Mouse.previousButtonState[lVar9] != '\0') &&
       (CORE.Input.Mouse.currentButtonState[lVar9] == '\0')) {
      pAVar10->events[pAVar10->count].frame = CORE.Time.frameCounter;
      pAVar10->events[pAVar10->count].type = 5;
      pAVar10->events[pAVar10->count].params[0] = (int)lVar9;
      pAVar10->events[pAVar10->count].params[1] = 0;
      pAVar10->events[pAVar10->count].params[2] = 0;
      pAVar1 = pAVar10->events;
      uVar8 = pAVar10->count;
      TraceLog(3,
               "AUTOMATION: Frame: %i | Event type: INPUT_MOUSE_BUTTON_UP | Event parameters: %i, %i, %i"
               ,(ulong)pAVar1[uVar8].frame,(ulong)(uint)pAVar1[uVar8].params[0],
               (ulong)(uint)pAVar1[uVar8].params[1],(ulong)(uint)pAVar1[uVar8].params[2]);
      pAVar10 = currentEventList;
      currentEventList->count = currentEventList->count + 1;
      uVar8 = pAVar10->capacity;
    }
    uVar4 = pAVar10->count;
    if (uVar4 == uVar8) break;
    if (CORE.Input.Mouse.currentButtonState[lVar9] != '\0') {
      pAVar10->events[uVar4].frame = CORE.Time.frameCounter;
      pAVar10->events[pAVar10->count].type = 6;
      pAVar10->events[pAVar10->count].params[0] = (int)lVar9;
      pAVar10->events[pAVar10->count].params[1] = 0;
      pAVar10->events[pAVar10->count].params[2] = 0;
      pAVar1 = pAVar10->events;
      uVar8 = pAVar10->count;
      TraceLog(3,
               "AUTOMATION: Frame: %i | Event type: INPUT_MOUSE_BUTTON_DOWN | Event parameters: %i, %i, %i"
               ,(ulong)pAVar1[uVar8].frame,(ulong)(uint)pAVar1[uVar8].params[0],
               (ulong)(uint)pAVar1[uVar8].params[1],(ulong)(uint)pAVar1[uVar8].params[2]);
      pAVar10 = currentEventList;
      uVar8 = currentEventList->capacity;
      uVar4 = currentEventList->count + 1;
      currentEventList->count = uVar4;
    }
    lVar9 = lVar9 + 1;
    if (uVar4 == uVar8) break;
LAB_0011fd97:
    if (lVar9 == 8) {
      if (((int)CORE.Input.Mouse.currentPosition.x != (int)CORE.Input.Mouse.previousPosition.x) ||
         ((int)CORE.Input.Mouse.currentPosition.y != (int)CORE.Input.Mouse.previousPosition.y)) {
        pAVar10->events[pAVar10->count].frame = CORE.Time.frameCounter;
        pAVar10->events[pAVar10->count].type = 7;
        pAVar10->events[pAVar10->count].params[0] = (int)CORE.Input.Mouse.currentPosition.x;
        pAVar10->events[pAVar10->count].params[1] = (int)CORE.Input.Mouse.currentPosition.y;
        pAVar10->events[pAVar10->count].params[2] = 0;
        pAVar1 = pAVar10->events;
        uVar8 = pAVar10->count;
        TraceLog(3,
                 "AUTOMATION: Frame: %i | Event type: INPUT_MOUSE_POSITION | Event parameters: %i, %i, %i"
                 ,(ulong)pAVar1[uVar8].frame,(ulong)(uint)pAVar1[uVar8].params[0],
                 (ulong)(uint)pAVar1[uVar8].params[1],(ulong)(uint)pAVar1[uVar8].params[2]);
        pAVar10 = currentEventList;
        uVar8 = currentEventList->capacity;
        uVar4 = currentEventList->count + 1;
        currentEventList->count = uVar4;
        if (uVar4 == uVar8) break;
      }
      if (((int)CORE.Input.Mouse.currentWheelMove.x != (int)CORE.Input.Mouse.previousWheelMove.x) ||
         ((int)CORE.Input.Mouse.currentWheelMove.y != (int)CORE.Input.Mouse.previousWheelMove.y)) {
        pAVar10->events[pAVar10->count].frame = CORE.Time.frameCounter;
        pAVar10->events[pAVar10->count].type = 8;
        pAVar10->events[pAVar10->count].params[0] = (int)CORE.Input.Mouse.currentWheelMove.x;
        pAVar10->events[pAVar10->count].params[1] = (int)CORE.Input.Mouse.currentWheelMove.y;
        pAVar10->events[pAVar10->count].params[2] = 0;
        pAVar1 = pAVar10->events;
        uVar8 = pAVar10->count;
        TraceLog(3,
                 "AUTOMATION: Frame: %i | Event type: INPUT_MOUSE_WHEEL_MOTION | Event parameters: %i, %i, %i"
                 ,(ulong)pAVar1[uVar8].frame,(ulong)(uint)pAVar1[uVar8].params[0],
                 (ulong)(uint)pAVar1[uVar8].params[1],(ulong)(uint)pAVar1[uVar8].params[2]);
        pAVar10 = currentEventList;
        uVar8 = currentEventList->capacity;
        uVar4 = currentEventList->count + 1;
        currentEventList->count = uVar4;
        if (uVar4 == uVar8) break;
      }
      lVar9 = 0;
      goto LAB_001200e7;
    }
  }
  goto LAB_001205d0;
  while( true ) {
    if (CORE.Input.Touch.currentTouchState[lVar9] != '\0') {
      pAVar10->events[uVar4].frame = CORE.Time.frameCounter;
      pAVar10->events[pAVar10->count].type = 0xf;
      pAVar10->events[pAVar10->count].params[0] = (int)lVar9;
      pAVar10->events[pAVar10->count].params[1] = 0;
      pAVar10->events[pAVar10->count].params[2] = 0;
      pAVar1 = pAVar10->events;
      uVar8 = pAVar10->count;
      TraceLog(3,
               "AUTOMATION: Frame: %i | Event type: INPUT_TOUCH_DOWN | Event parameters: %i, %i, %i"
               ,(ulong)pAVar1[uVar8].frame,(ulong)(uint)pAVar1[uVar8].params[0],
               (ulong)(uint)pAVar1[uVar8].params[1],(ulong)(uint)pAVar1[uVar8].params[2]);
      pAVar10 = currentEventList;
      uVar8 = currentEventList->capacity;
      uVar4 = currentEventList->count + 1;
      currentEventList->count = uVar4;
    }
    lVar9 = lVar9 + 1;
    if (uVar4 == uVar8) break;
LAB_001200e7:
    if (lVar9 == 8) {
      lVar9 = 0x1c3a50;
      local_70 = 0x1c3b50;
      for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
        lVar6 = 0;
        while (gamepad_00 = (int)uVar7, lVar6 != 0x20) {
          if ((*(char *)(lVar9 + 0x80 + lVar6) != '\0') && (*(char *)(lVar9 + lVar6) == '\0')) {
            pAVar10->events[pAVar10->count].frame = CORE.Time.frameCounter;
            pAVar10->events[pAVar10->count].type = 0xb;
            pAVar10->events[pAVar10->count].params[0] = gamepad_00;
            pAVar10->events[pAVar10->count].params[1] = (int)lVar6;
            pAVar10->events[pAVar10->count].params[2] = 0;
            pAVar1 = pAVar10->events;
            uVar8 = pAVar10->count;
            TraceLog(3,
                     "AUTOMATION: Frame: %i | Event type: INPUT_GAMEPAD_BUTTON_UP | Event parameters: %i, %i, %i"
                     ,(ulong)pAVar1[uVar8].frame,(ulong)(uint)pAVar1[uVar8].params[0],
                     (ulong)(uint)pAVar1[uVar8].params[1],(ulong)(uint)pAVar1[uVar8].params[2]);
            pAVar10 = currentEventList;
            currentEventList->count = currentEventList->count + 1;
            uVar8 = pAVar10->capacity;
          }
          if (pAVar10->count == uVar8) goto LAB_00120523;
          if (*(char *)(lVar9 + lVar6) == '\0') {
            uVar4 = pAVar10->count;
          }
          else {
            pAVar10->events[pAVar10->count].frame = CORE.Time.frameCounter;
            pAVar10->events[pAVar10->count].type = 0xc;
            pAVar10->events[pAVar10->count].params[0] = gamepad_00;
            pAVar10->events[pAVar10->count].params[1] = (int)lVar6;
            pAVar10->events[pAVar10->count].params[2] = 0;
            pAVar1 = pAVar10->events;
            uVar8 = pAVar10->count;
            TraceLog(3,
                     "AUTOMATION: Frame: %i | Event type: INPUT_GAMEPAD_BUTTON_DOWN | Event parameters: %i, %i, %i"
                     ,(ulong)pAVar1[uVar8].frame,(ulong)(uint)pAVar1[uVar8].params[0],
                     (ulong)(uint)pAVar1[uVar8].params[1],(ulong)(uint)pAVar1[uVar8].params[2]);
            pAVar10 = currentEventList;
            uVar8 = currentEventList->capacity;
            uVar4 = currentEventList->count + 1;
            currentEventList->count = uVar4;
          }
          lVar6 = lVar6 + 1;
          if (uVar4 == uVar8) goto LAB_00120523;
        }
        lVar6 = 0;
        while (lVar6 != 8) {
          uVar4 = (uint)lVar6;
          fVar11 = -1.0;
          if ((uVar4 & 6) != 4) {
            fVar11 = 0.0;
          }
          fVar12 = GetGamepadAxisMovement(gamepad_00,uVar4);
          if ((fVar12 != fVar11) || (NAN(fVar12) || NAN(fVar11))) {
            pAVar10->events[pAVar10->count].frame = CORE.Time.frameCounter;
            pAVar10->events[pAVar10->count].type = 0xd;
            pAVar10->events[pAVar10->count].params[0] = gamepad_00;
            pAVar10->events[pAVar10->count].params[1] = uVar4;
            pAVar10->events[pAVar10->count].params[2] =
                 (int)(*(float *)(local_70 + lVar6 * 4) * 32768.0);
            pAVar1 = pAVar10->events;
            uVar8 = pAVar10->count;
            TraceLog(3,
                     "AUTOMATION: Frame: %i | Event type: INPUT_GAMEPAD_AXIS_MOTION | Event parameters: %i, %i, %i"
                     ,(ulong)pAVar1[uVar8].frame,(ulong)(uint)pAVar1[uVar8].params[0],
                     (ulong)(uint)pAVar1[uVar8].params[1],(ulong)(uint)pAVar1[uVar8].params[2]);
            pAVar10 = currentEventList;
            uVar8 = currentEventList->capacity;
            uVar4 = currentEventList->count + 1;
            currentEventList->count = uVar4;
          }
          else {
            uVar4 = pAVar10->count;
          }
          lVar6 = lVar6 + 1;
          if (uVar4 == uVar8) goto LAB_00120523;
        }
        lVar9 = lVar9 + 0x20;
        local_70 = local_70 + 0x20;
      }
LAB_00120523:
      uVar8 = GESTURES.current;
      if (GESTURES.current != 0 && 3 < uVar7) {
        pAVar10->events[pAVar10->count].frame = CORE.Time.frameCounter;
        pAVar10->events[pAVar10->count].type = 0x11;
        pAVar10->events[pAVar10->count].params[0] = uVar8;
        pAVar10->events[pAVar10->count].params[1] = 0;
        pAVar10->events[pAVar10->count].params[2] = 0;
        pAVar1 = pAVar10->events;
        uVar8 = pAVar10->count;
        TraceLog(3,
                 "AUTOMATION: Frame: %i | Event type: INPUT_GESTURE | Event parameters: %i, %i, %i",
                 (ulong)pAVar1[uVar8].frame,(ulong)(uint)pAVar1[uVar8].params[0],
                 (ulong)(uint)pAVar1[uVar8].params[1],(ulong)(uint)pAVar1[uVar8].params[2]);
        currentEventList->count = currentEventList->count + 1;
      }
      break;
    }
    if ((CORE.Input.Touch.previousTouchState[lVar9] != '\0') &&
       (CORE.Input.Touch.currentTouchState[lVar9] == '\0')) {
      pAVar10->events[pAVar10->count].frame = CORE.Time.frameCounter;
      pAVar10->events[pAVar10->count].type = 0xe;
      pAVar10->events[pAVar10->count].params[0] = (int)lVar9;
      pAVar10->events[pAVar10->count].params[1] = 0;
      pAVar10->events[pAVar10->count].params[2] = 0;
      pAVar1 = pAVar10->events;
      uVar8 = pAVar10->count;
      TraceLog(3,"AUTOMATION: Frame: %i | Event type: INPUT_TOUCH_UP | Event parameters: %i, %i, %i"
               ,(ulong)pAVar1[uVar8].frame,(ulong)(uint)pAVar1[uVar8].params[0],
               (ulong)(uint)pAVar1[uVar8].params[1],(ulong)(uint)pAVar1[uVar8].params[2]);
      pAVar10 = currentEventList;
      currentEventList->count = currentEventList->count + 1;
      uVar8 = pAVar10->capacity;
    }
    uVar4 = pAVar10->count;
    if (uVar4 == uVar8) break;
  }
LAB_001205d0:
  SwapScreenBuffer();
  CORE.Time.current = glfwGetTime();
  CORE.Time.draw = CORE.Time.current - CORE.Time.previous;
  CORE.Time.frame = CORE.Time.draw + CORE.Time.update;
  CORE.Time.previous = CORE.Time.current;
  if (CORE.Time.frame < CORE.Time.target) {
    CORE.Time.previous = CORE.Time.current;
    WaitTime(CORE.Time.target - CORE.Time.frame);
    dVar3 = glfwGetTime();
    CORE.Time.frame = (dVar3 - CORE.Time.previous) + CORE.Time.frame;
    CORE.Time.previous = dVar3;
  }
  CORE.Time.current = CORE.Time.previous;
  PollInputEvents();
  if ((CORE.Input.Keyboard.previousKeyState[0x12d] == '\0') &&
     (CORE.Input.Keyboard.currentKeyState[0x12d] == '\x01')) {
    if (CORE.Input.Keyboard.currentKeyState[0x155] == '\x01') {
      if (gifRecording == '\x01') {
        gifRecording = '\0';
        msf_gif_end(&result,&gifState);
        pcVar5 = TextFormat("%s/screenrec%03i.gif",CORE.Storage.basePath,
                            (ulong)(uint)screenshotCounter);
        SaveFileData(pcVar5,result.data,(int)result.dataSize);
        free(result.data);
        TraceLog(3,"SYSTEM: Finish animated GIF recording");
      }
      else {
        gifRecording = '\x01';
        gifFrameCounter = 0;
        VVar2 = GetWindowScaleDPI();
        msf_gif_begin(&gifState,(int)((float)CORE.Window.render.width * VVar2.x),
                      (int)(VVar2.y * (float)CORE.Window.render.height));
        screenshotCounter = screenshotCounter + 1;
        pcVar5 = TextFormat("screenrec%03i.gif");
        TraceLog(3,"SYSTEM: Start animated GIF recording: %s",pcVar5);
      }
    }
    else {
      pcVar5 = TextFormat("screenshot%03i.png",(ulong)(uint)screenshotCounter);
      TakeScreenshot(pcVar5);
      screenshotCounter = screenshotCounter + 1;
    }
  }
  CORE.Time.frameCounter = CORE.Time.frameCounter + 1;
  return;
}

Assistant:

void EndDrawing(void)
{
    rlDrawRenderBatchActive();      // Update and draw internal render batch

#if defined(SUPPORT_GIF_RECORDING)
    // Draw record indicator
    if (gifRecording)
    {
        #ifndef GIF_RECORD_FRAMERATE
        #define GIF_RECORD_FRAMERATE    10
        #endif
        gifFrameCounter += (unsigned int)(GetFrameTime()*1000);

        // NOTE: We record one gif frame depending on the desired gif framerate
        if (gifFrameCounter > 1000/GIF_RECORD_FRAMERATE)
        {
            // Get image data for the current frame (from backbuffer)
            // NOTE: This process is quite slow... :(
            Vector2 scale = GetWindowScaleDPI();
            unsigned char *screenData = rlReadScreenPixels((int)((float)CORE.Window.render.width*scale.x), (int)((float)CORE.Window.render.height*scale.y));

            #ifndef GIF_RECORD_BITRATE
            #define GIF_RECORD_BITRATE 16
            #endif

            // Add the frame to the gif recording, given how many frames have passed in centiseconds
            msf_gif_frame(&gifState, screenData, gifFrameCounter/10, GIF_RECORD_BITRATE, (int)((float)CORE.Window.render.width*scale.x)*4);
            gifFrameCounter -= 1000/GIF_RECORD_FRAMERATE;

            RL_FREE(screenData);    // Free image data
        }

    #if defined(SUPPORT_MODULE_RSHAPES) && defined(SUPPORT_MODULE_RTEXT)
        // Display the recording indicator every half-second
        if ((int)(GetTime()/0.5)%2 == 1)
        {
            DrawCircle(30, CORE.Window.screen.height - 20, 10, MAROON);                 // WARNING: Module required: rshapes
            DrawText("GIF RECORDING", 50, CORE.Window.screen.height - 25, 10, RED);     // WARNING: Module required: rtext
        }
    #endif

        rlDrawRenderBatchActive();  // Update and draw internal render batch
    }
#endif

#if defined(SUPPORT_AUTOMATION_EVENTS)
    if (automationEventRecording) RecordAutomationEvent();    // Event recording
#endif

#if !defined(SUPPORT_CUSTOM_FRAME_CONTROL)
    SwapScreenBuffer();                  // Copy back buffer to front buffer (screen)

    // Frame time control system
    CORE.Time.current = GetTime();
    CORE.Time.draw = CORE.Time.current - CORE.Time.previous;
    CORE.Time.previous = CORE.Time.current;

    CORE.Time.frame = CORE.Time.update + CORE.Time.draw;

    // Wait for some milliseconds...
    if (CORE.Time.frame < CORE.Time.target)
    {
        WaitTime(CORE.Time.target - CORE.Time.frame);

        CORE.Time.current = GetTime();
        double waitTime = CORE.Time.current - CORE.Time.previous;
        CORE.Time.previous = CORE.Time.current;

        CORE.Time.frame += waitTime;    // Total frame time: update + draw + wait
    }

    PollInputEvents();      // Poll user events (before next frame update)
#endif

#if defined(SUPPORT_SCREEN_CAPTURE)
    if (IsKeyPressed(KEY_F12))
    {
#if defined(SUPPORT_GIF_RECORDING)
        if (IsKeyDown(KEY_LEFT_CONTROL))
        {
            if (gifRecording)
            {
                gifRecording = false;

                MsfGifResult result = msf_gif_end(&gifState);

                SaveFileData(TextFormat("%s/screenrec%03i.gif", CORE.Storage.basePath, screenshotCounter), result.data, (unsigned int)result.dataSize);
                msf_gif_free(result);

                TRACELOG(LOG_INFO, "SYSTEM: Finish animated GIF recording");
            }
            else
            {
                gifRecording = true;
                gifFrameCounter = 0;

                Vector2 scale = GetWindowScaleDPI();
                msf_gif_begin(&gifState, (int)((float)CORE.Window.render.width*scale.x), (int)((float)CORE.Window.render.height*scale.y));
                screenshotCounter++;

                TRACELOG(LOG_INFO, "SYSTEM: Start animated GIF recording: %s", TextFormat("screenrec%03i.gif", screenshotCounter));
            }
        }
        else
#endif  // SUPPORT_GIF_RECORDING
        {
            TakeScreenshot(TextFormat("screenshot%03i.png", screenshotCounter));
            screenshotCounter++;
        }
    }
#endif  // SUPPORT_SCREEN_CAPTURE

    CORE.Time.frameCounter++;
}